

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void av1_get_inv_txfm_cfg(TX_TYPE tx_type,TX_SIZE tx_size,TXFM_2D_FLIP_CFG *cfg)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *in_RDX;
  byte in_SIL;
  byte in_DIL;
  int txh_idx;
  int txw_idx;
  TX_TYPE_1D tx_type_1d_row;
  TX_TYPE_1D tx_type_1d_col;
  TXFM_2D_FLIP_CFG *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  TX_TYPE tx_type_00;
  
  tx_type_00 = (TX_TYPE)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  *in_RDX = in_SIL;
  memset(in_RDX + 0x1a,0,0xc);
  memset(in_RDX + 0x26,0,0xc);
  set_flip_cfg(tx_type_00,in_stack_ffffffffffffffd8);
  bVar1 = ""[in_DIL];
  bVar2 = ""[in_DIL];
  *(int8_t **)(in_RDX + 0x10) = av1_inv_txfm_shift_ls[in_SIL];
  iVar3 = get_txw_idx(in_SIL);
  iVar4 = get_txh_idx(in_SIL);
  in_RDX[0x18] = 0xc;
  in_RDX[0x19] = 0xc;
  in_RDX[0x32] = av1_txfm_type_ls[iVar4][bVar1];
  if (in_RDX[0x32] == 5) {
    in_RDX[0x1a] = 0;
    in_RDX[0x1b] = 1;
    in_RDX[0x1c] = 0;
    in_RDX[0x1d] = 0;
    in_RDX[0x1e] = 0;
    in_RDX[0x1f] = 0;
    in_RDX[0x20] = 0;
  }
  in_RDX[0x33] = av1_txfm_type_ls[iVar3][bVar2];
  if (in_RDX[0x33] == 5) {
    in_RDX[0x26] = 0;
    in_RDX[0x27] = 1;
    in_RDX[0x28] = 0;
    in_RDX[0x29] = 0;
    in_RDX[0x2a] = 0;
    in_RDX[0x2b] = 0;
    in_RDX[0x2c] = 0;
  }
  *(int *)(in_RDX + 0x34) = (int)"\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[in_RDX[0x32]];
  *(int *)(in_RDX + 0x38) = (int)"\x04\x06\b\n\f\a\b\n\x01\x01\x01\x01"[in_RDX[0x33]];
  return;
}

Assistant:

void av1_get_inv_txfm_cfg(TX_TYPE tx_type, TX_SIZE tx_size,
                          TXFM_2D_FLIP_CFG *cfg) {
  assert(cfg != NULL);
  cfg->tx_size = tx_size;
  av1_zero(cfg->stage_range_col);
  av1_zero(cfg->stage_range_row);
  set_flip_cfg(tx_type, cfg);
  const TX_TYPE_1D tx_type_1d_col = vtx_tab[tx_type];
  const TX_TYPE_1D tx_type_1d_row = htx_tab[tx_type];
  cfg->shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  cfg->cos_bit_col = INV_COS_BIT;
  cfg->cos_bit_row = INV_COS_BIT;
  cfg->txfm_type_col = av1_txfm_type_ls[txh_idx][tx_type_1d_col];
  if (cfg->txfm_type_col == TXFM_TYPE_ADST4) {
    memcpy(cfg->stage_range_col, iadst4_range, sizeof(iadst4_range));
  }
  cfg->txfm_type_row = av1_txfm_type_ls[txw_idx][tx_type_1d_row];
  if (cfg->txfm_type_row == TXFM_TYPE_ADST4) {
    memcpy(cfg->stage_range_row, iadst4_range, sizeof(iadst4_range));
  }
  cfg->stage_num_col = av1_txfm_stage_num_list[cfg->txfm_type_col];
  cfg->stage_num_row = av1_txfm_stage_num_list[cfg->txfm_type_row];
}